

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureSamplerCase::init
          (TextureSamplerCase *this,EVP_PKEY_CTX *ctx)

{
  allocator<unsigned_char> *this_00;
  deUint32 *this_01;
  GLenum GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  int extraout_EAX;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  NotSupportedError *this_02;
  long lVar7;
  reference pvVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  EVP_PKEY_CTX *ctx_00;
  int local_564;
  undefined1 local_560 [4];
  int faceNdx;
  int local_3dc;
  undefined1 local_3d8 [4];
  int level;
  MessageBuilder local_258;
  int local_d4;
  int local_d0;
  int y;
  int x;
  Random rnd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texData;
  Functions *gl;
  string local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  TextureSamplerCase *pTStack_10;
  GLint maxTextureSize;
  TextureSamplerCase *this_local;
  undefined4 extraout_var_00;
  
  local_14 = 0;
  pTStack_10 = this;
  pRVar6 = Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  ctx_00 = (EVP_PKEY_CTX *)&local_14;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))(0xd33);
  if (0x7f < local_14) {
    RenderCase::init(&this->super_RenderCase,ctx_00);
    pRVar6 = Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
    iVar3 = (*pRVar6->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var_00,iVar3);
    this_00 = (allocator<unsigned_char> *)((long)&rnd.m_rnd.z + 3);
    std::allocator<unsigned_char>::allocator(this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0x10000,this_00
              );
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&rnd.m_rnd.z + 3));
    de::Random::Random((Random *)&y,0x3039);
    (**(code **)(lVar7 + 0x6f8))(1,&this->m_textureID);
    for (local_d0 = 0; local_d0 < 0x80; local_d0 = local_d0 + 1) {
      for (local_d4 = 0; local_d4 < 0x80; local_d4 = local_d4 + 1) {
        dVar4 = de::Random::getUint32((Random *)&y);
        this_01 = &rnd.m_rnd.w;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
                            (long)((local_d0 * 0x80 + local_d4) * 4));
        *pvVar8 = (value_type)dVar4;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
                            (long)((local_d0 * 0x80 + local_d4) * 4 + 1));
        *pvVar8 = 0xff;
        dVar4 = de::Random::getUint32((Random *)&y);
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,
                            (long)((local_d0 * 0x80 + local_d4) * 4 + 2));
        *pvVar8 = (value_type)dVar4;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,
                            (long)((local_d0 * 0x80 + local_d4) * 4 + 3));
        *pvVar8 = 0xff;
      }
    }
    if (this->m_testType == TEST_TEX_COORD) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_258,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_258,(char (*) [43])"Creating a 2D texture with a test pattern.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_258);
      (**(code **)(lVar7 + 0xb8))(0xde1,this->m_textureID);
      pcVar2 = *(code **)(lVar7 + 0x1310);
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0);
      (*pcVar2)(0xde1,0,0x8058,0x80,0x80,0,0x1908,0x1401,pvVar8);
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2601);
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2601);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"TextureSamplerCase::init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                      ,0x58e);
    }
    else if ((this->m_testType == TEST_LOD) || (this->m_testType == TEST_GRAD)) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_3d8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_3d8,
                           (char (*) [53])"Creating a mipmapped 2D texture with a test pattern.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3d8);
      (**(code **)(lVar7 + 0xb8))(0xde1,this->m_textureID);
      for (local_3dc = 0; iVar3 = local_3dc, 0x80 >> ((byte)local_3dc & 0x1f) != 0;
          local_3dc = local_3dc + 1) {
        pcVar2 = *(code **)(lVar7 + 0x1310);
        uVar5 = 0x80 >> ((byte)local_3dc & 0x1f);
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0)
        ;
        (*pcVar2)(0xde1,iVar3,0x8058,uVar5,uVar5,0,0x1908,0x1401,pvVar8);
      }
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2601);
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2703);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"TextureSamplerCase::init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                      ,0x59b);
    }
    else if (this->m_testType == TEST_TEX_COORD_CUBE) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_560,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_560,
                           (char (*) [41])"Creating a cube map with a test pattern.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_560);
      (**(code **)(lVar7 + 0xb8))(0x8513,this->m_textureID);
      for (local_564 = 0; local_564 < 6; local_564 = local_564 + 1) {
        pcVar2 = *(code **)(lVar7 + 0x1310);
        GVar1 = init::faces[local_564];
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w,0)
        ;
        (*pcVar2)(GVar1,0,0x8058,0x20,0x20,0,0x1908,0x1401,pvVar8);
      }
      (**(code **)(lVar7 + 0x1360))(0x8513,0x2800,0x2601);
      (**(code **)(lVar7 + 0x1360))(0x8513,0x2801,0x2601);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"TextureSamplerCase::init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                      ,0x5b4);
    }
    de::Random::~Random((Random *)&y);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&rnd.m_rnd.w);
    return extraout_EAX;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"GL_MAX_TEXTURE_SIZE must be at least ",&local_59);
  de::toString<int>(&local_90,&Stress::(anonymous_namespace)::TEST_TEXTURE_SIZE);
  std::operator+(&local_38,&local_58,&local_90);
  tcu::NotSupportedError::NotSupportedError(this_02,&local_38);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureSamplerCase::init (void)
{
	// requirements
	{
		GLint maxTextureSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
		if (maxTextureSize < TEST_TEXTURE_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_TEXTURE_SIZE));
	}

	RenderCase::init();

	// gen texture
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		std::vector<deUint8>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE*4);
		de::Random				rnd		(12345);

		gl.genTextures(1, &m_textureID);

		for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
		for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
		{
			// RGBA8, green and alpha channel are always 255 for verification
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 0] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 1] = 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 2] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 3] = 0xFF;
		}

		if (m_testType == TEST_TEX_COORD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_LOD || m_testType == TEST_GRAD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a mipmapped 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);

			for (int level = 0; (TEST_TEXTURE_SIZE >> level); ++level)
				gl.texImage2D(GL_TEXTURE_2D, level, GL_RGBA8, TEST_TEXTURE_SIZE >> level, TEST_TEXTURE_SIZE >> level, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_TEX_COORD_CUBE)
		{
			DE_STATIC_ASSERT(TEST_TEXTURE_CUBE_SIZE <= TEST_TEXTURE_SIZE);

			static const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
			};

			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a cube map with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textureID);

			for (int faceNdx = 0; faceNdx < DE_LENGTH_OF_ARRAY(faces); ++faceNdx)
				gl.texImage2D(faces[faceNdx], 0, GL_RGBA8, TEST_TEXTURE_CUBE_SIZE, TEST_TEXTURE_CUBE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else
			DE_ASSERT(DE_FALSE);
	}
}